

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qp.c
# Opt level: O1

void validate_qp(char *file_src,char *file_tmp,char *file_res,int mode,int rm_tmp_file)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *__s2;
  char local_158 [8];
  char line [250];
  char *local_40;
  char *fname;
  char lt [3];
  
  fname._6_1_ = 0;
  fname._4_2_ = 0xa0d;
  local_40 = (char *)0x0;
  pcVar5 = (char *)0x0;
  unique0x1000031c = file_res;
  asprintf(&local_40,"%s/%s","samples",file_src);
  pFVar2 = fopen(local_40,"r");
  pcVar3 = fgets(local_158,0xfa,pFVar2);
  if (pcVar3 != (char *)0x0) {
    do {
      uVar4 = cmime_string_chomp(local_158);
      if (mode == 1) {
        pcVar5 = (char *)cmime_qp_encode(uVar4,(long)&fname + 4);
      }
      else {
        pcVar5 = (char *)cmime_qp_decode_text(uVar4);
      }
      pcVar3 = fgets(local_158,0xfa,pFVar2);
    } while (pcVar3 != (char *)0x0);
  }
  fclose(pFVar2);
  free(local_40);
  asprintf(&local_40,"%s/%s","samples",file_tmp);
  pFVar2 = fopen(local_40,"w");
  if (pFVar2 != (FILE *)0x0) {
    fputs(pcVar5,pFVar2);
    fclose(pFVar2);
  }
  free(pcVar5);
  pFVar2 = fopen(local_40,"r");
  pcVar3 = fgets(local_158,0xfa,pFVar2);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    do {
      pcVar3 = (char *)cmime_string_chomp(local_158);
      pcVar5 = fgets(local_158,0xfa,pFVar2);
    } while (pcVar5 != (char *)0x0);
  }
  fclose(pFVar2);
  if (rm_tmp_file == 1) {
    remove(local_40);
  }
  free(local_40);
  __s2 = (char *)0x0;
  asprintf(&local_40,"%s/%s","samples",stack0xffffffffffffffa8);
  pFVar2 = fopen(local_40,"r");
  pcVar5 = fgets(local_158,0xfa,pFVar2);
  if (pcVar5 != (char *)0x0) {
    do {
      __s2 = (char *)cmime_string_chomp(local_158);
      pcVar5 = fgets(local_158,0xfa,pFVar2);
    } while (pcVar5 != (char *)0x0);
  }
  fclose(pFVar2);
  free(local_40);
  iVar1 = strcmp(pcVar3,__s2);
  if (iVar1 != 0) {
    __assert_fail("strcmp(so,res)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_qp.c"
                  ,0x5b,"void validate_qp(char *, char *, char *, int, int)");
  }
  return;
}

Assistant:

void validate_qp(char *file_src, char *file_tmp, char *file_res, int mode, int rm_tmp_file) {
    
    char line[250];
    char lt[]="\r\n";
    FILE *f1 = NULL;
    FILE *f1_out = NULL;
    FILE *f1_out_in = NULL;
    FILE *f2 = NULL;
    char *fname = NULL;
    char *si = NULL; 
    char *so = NULL;
    char *res = NULL;

    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_src);
    f1 = fopen(fname, "r");
    while(fgets(line, 250, f1)) {
        char *clean;
        clean = cmime_string_chomp(line);
        if(mode == 1) {
            si = cmime_qp_encode(clean, lt);
        } else {
            si = cmime_qp_decode_text(clean);
        }
    }
    fclose(f1);
    free(fname);
    // write the encoded string to the temporary output file
    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_tmp);
    f1_out = fopen (fname, "w");
    if (f1_out != NULL) { 
        fprintf(f1_out,"%s",si);
        fclose(f1_out);
    }
    free(si);
    // read it out again
    f1_out_in = fopen(fname, "r");
    while(fgets(line, 250, f1_out_in)) {
        so = cmime_string_chomp(line);
    }
    fclose(f1_out_in);
    if(rm_tmp_file == 1) remove(fname);
    free(fname);
    // now open the file that contains the result string
    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_res);
    f2 = fopen(fname, "r");
    while(fgets(line, 250, f2)) {
        res = cmime_string_chomp(line);
    }
    fclose(f2);
    free(fname);
    // comparison
    assert(strcmp(so,res)==0);
}